

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.c
# Opt level: O0

uint MCRegisterInfo_getMatchingSuperReg(MCRegisterInfo *RI,uint Reg,uint SubIdx,MCRegisterClass *RC)

{
  _Bool _Var1;
  uint16_t uVar2;
  uint uVar3;
  MCRegisterClass *in_RCX;
  undefined4 in_EDX;
  uint in_ESI;
  long *in_RDI;
  bool bVar4;
  uint16_t val;
  DiffListIterator iter;
  DiffListIterator local_30;
  uint uVar5;
  
  if (in_ESI < *(uint *)(in_RDI + 1)) {
    DiffListIterator_init
              (&local_30,(MCPhysReg)in_ESI,
               (MCPhysReg *)(in_RDI[6] + (ulong)*(uint *)(*in_RDI + (ulong)in_ESI * 0x18 + 8) * 2));
    DiffListIterator_next(&local_30);
    while (_Var1 = DiffListIterator_isValid(&local_30), _Var1) {
      uVar2 = DiffListIterator_getVal(&local_30);
      _Var1 = MCRegisterClass_contains(in_RCX,(uint)uVar2);
      if ((_Var1) &&
         (uVar5 = in_ESI,
         uVar3 = MCRegisterInfo_getSubReg
                           ((MCRegisterInfo *)CONCAT44(in_ESI,in_EDX),(uint)((ulong)in_RCX >> 0x20),
                            (uint)in_RCX), bVar4 = in_ESI == uVar3, in_ESI = uVar5, bVar4)) {
        return (uint)uVar2;
      }
      DiffListIterator_next(&local_30);
    }
  }
  return 0;
}

Assistant:

unsigned MCRegisterInfo_getMatchingSuperReg(const MCRegisterInfo *RI, unsigned Reg, unsigned SubIdx, const MCRegisterClass *RC)
{
	DiffListIterator iter;

	if (Reg >= RI->NumRegs) {
		return 0;
	}

	DiffListIterator_init(&iter, (MCPhysReg)Reg, RI->DiffLists + RI->Desc[Reg].SuperRegs);
	DiffListIterator_next(&iter);

	while(DiffListIterator_isValid(&iter)) {
		uint16_t val = DiffListIterator_getVal(&iter);
		if (MCRegisterClass_contains(RC, val) && Reg ==  MCRegisterInfo_getSubReg(RI, val, SubIdx))
			return val;

		DiffListIterator_next(&iter);
	}

	return 0;
}